

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# help_printer.hpp
# Opt level: O0

void Args::printOffset(OutStreamType *to,size_type currentPos,size_type leftMargin)

{
  ulong in_RDX;
  ulong in_RSI;
  ostream *in_RDI;
  allocator local_39;
  string local_38 [56];
  
  if (in_RSI < in_RDX) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_38,in_RDX - in_RSI,' ',&local_39);
    std::operator<<(in_RDI,local_38);
    std::__cxx11::string::~string(local_38);
    std::allocator<char>::~allocator((allocator<char> *)&local_39);
  }
  return;
}

Assistant:

static inline void
printOffset( OutStreamType & to, String::size_type currentPos,
	String::size_type leftMargin )
{
	if( currentPos < leftMargin )
		to << String( leftMargin - currentPos, ' ' );
}